

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O1

void Tools::deque_remove_element_at_index<PhyloTreeEdge>
               (deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *c,size_t index)

{
  _Elt_pointer pPVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  iterator local_40;
  iterator local_20;
  
  pPVar1 = (c->super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  local_20._M_node =
       (c->super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  uVar2 = ((long)pPVar1 -
           (long)(c->super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) * -0x71c71c71c71c71c7 + index;
  if (uVar2 < 7) {
    lVar3 = index * 9;
  }
  else {
    if ((long)uVar2 < 1) {
      uVar4 = ~(~uVar2 / 7);
    }
    else {
      uVar4 = uVar2 / 7;
    }
    local_20._M_node = local_20._M_node + uVar4;
    pPVar1 = *local_20._M_node + uVar4 * -7;
    lVar3 = uVar2 * 9;
  }
  local_20._M_cur = (_Elt_pointer)(&(pPVar1->super_Bipartition)._vptr_Bipartition + lVar3);
  local_20._M_first = *local_20._M_node;
  local_20._M_last = local_20._M_first + 7;
  std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_M_erase(&local_40,c,&local_20);
  return;
}

Assistant:

static void deque_remove_element_at_index(deque<T> &c, size_t index) {
        c.erase(c.begin() + index);
    }